

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O1

string * __thiscall
pbrt::MarbleTexture::ToString_abi_cxx11_(string *__return_storage_ptr__,MarbleTexture *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<pbrt::TextureMapping3DHandle_const&,int_const&,float_const&,float_const&,float_const&>
            (__return_storage_ptr__,
             "[ MarbleTexture mapping: %s octaves: %d omega: %f scale: %f variation: %f ]",
             &this->mapping,&this->octaves,&this->omega,&this->scale,&this->variation);
  return __return_storage_ptr__;
}

Assistant:

std::string MarbleTexture::ToString() const {
    return StringPrintf("[ MarbleTexture mapping: %s octaves: %d omega: %f "
                        "scale: %f variation: %f ]",
                        mapping, octaves, omega, scale, variation);
}